

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoTableGrow(Thread *this,Instr instr,Ptr *out_trap)

{
  pointer pRVar1;
  pointer pRVar2;
  Table *this_00;
  Result RVar3;
  undefined8 extraout_RDX;
  ulong uVar4;
  Value VVar5;
  Value VVar6;
  RefPtr<wabt::interp::Table> local_48;
  
  RefPtr<wabt::interp::Table>::RefPtr
            (&local_48,this->store_,
             (Ref)(this->inst_->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  this_00 = local_48.obj_;
  pRVar1 = ((local_48.obj_)->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pRVar2 = ((local_48.obj_)->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  VVar5 = Pop(this);
  VVar6 = Pop(this);
  RVar3 = Table::Grow(this_00,this->store_,VVar5.i32_,VVar6.ref_.index);
  uVar4 = 0xffffffff;
  if (RVar3.enum_ != Error) {
    uVar4 = (ulong)((long)pRVar1 - (long)pRVar2) >> 3 & 0xffffffff;
  }
  VVar5._8_8_ = extraout_RDX;
  VVar5.i64_ = uVar4;
  Push(this,VVar5);
  if (local_48.obj_ != (Table *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_48.store_)->roots_,local_48.root_index_);
  }
  return Ok;
}

Assistant:

RunResult Thread::DoTableGrow(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32]};
  u32 old_size = table->size();
  auto delta = Pop<u32>();
  auto ref = Pop<Ref>();
  if (Failed(table->Grow(store_, delta, ref))) {
    Push<s32>(-1);
  } else {
    Push<u32>(old_size);
  }
  return RunResult::Ok;
}